

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O0

void __thiscall LexerTest_LexNan_Test::TestBody(LexerTest_LexNan_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  _Storage<double,_true> extraout_XMM0_Qa;
  _Storage<double,_true> extraout_XMM0_Qa_00;
  _Storage<double,_true> extraout_XMM0_Qa_01;
  _Storage<double,_true> extraout_XMM0_Qa_02;
  _Storage<double,_true> extraout_XMM0_Qa_03;
  _Storage<double,_true> extraout_XMM0_Qa_04;
  _Storage<double,_true> extraout_XMM0_Qa_05;
  _Storage<double,_true> extraout_XMM0_Qa_06;
  _Storage<double,_true> extraout_XMM0_Qa_07;
  _Storage<double,_true> extraout_XMM0_Qa_08;
  undefined8 extraout_XMM0_Qa_09;
  undefined8 extraout_XMM0_Qa_10;
  undefined8 extraout_XMM0_Qa_11;
  undefined8 extraout_XMM0_Qa_12;
  undefined8 extraout_XMM0_Qa_13;
  undefined8 extraout_XMM0_Qa_14;
  undefined8 extraout_XMM0_Qa_15;
  undefined8 extraout_XMM0_Qa_16;
  undefined8 extraout_XMM0_Qa_17;
  undefined8 extraout_XMM0_Qa_18;
  undefined8 extraout_XMM0_Qa_19;
  string local_22c8;
  AssertHelper local_22a8;
  Message local_22a0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2290;
  string_view local_2268;
  Lexer local_2258;
  undefined8 local_2200;
  undefined1 local_21f8;
  bool local_21e9;
  undefined1 local_21e8 [8];
  AssertionResult gtest_ar__37;
  AssertHelper local_21b8;
  Message local_21b0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_21a0;
  string_view local_2178;
  Lexer local_2168;
  undefined8 local_210c;
  bool local_2101;
  undefined1 local_2100 [8];
  AssertionResult gtest_ar__36;
  AssertHelper local_20d0;
  Message local_20c8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20b8;
  string_view local_2090;
  Lexer local_2080;
  undefined8 local_2028;
  undefined1 local_2020;
  bool local_2011;
  undefined1 local_2010 [8];
  AssertionResult gtest_ar__35;
  AssertHelper local_1fe0;
  Message local_1fd8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1fc8;
  string_view local_1fa0;
  Lexer local_1f90;
  undefined8 local_1f34;
  bool local_1f29;
  undefined1 local_1f28 [8];
  AssertionResult gtest_ar__34;
  AssertHelper local_1ef8;
  Message local_1ef0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1ee0;
  string_view local_1eb8;
  Lexer local_1ea8;
  undefined8 local_1e50;
  undefined1 local_1e48;
  bool local_1e39;
  undefined1 local_1e38 [8];
  AssertionResult gtest_ar__33;
  AssertHelper local_1e08;
  Message local_1e00 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1df0;
  string_view local_1dc8;
  Lexer local_1db8;
  undefined8 local_1d5c;
  bool local_1d51;
  undefined1 local_1d50 [8];
  AssertionResult gtest_ar__32;
  AssertHelper local_1d20;
  Message local_1d18 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d08;
  string_view local_1ce0;
  Lexer local_1cd0;
  undefined8 local_1c78;
  undefined1 local_1c70;
  bool local_1c61;
  undefined1 local_1c60 [8];
  AssertionResult gtest_ar__31;
  AssertHelper local_1c30;
  Message local_1c28 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c18;
  string_view local_1bf0;
  Lexer local_1be0;
  undefined8 local_1b84;
  bool local_1b79;
  undefined1 local_1b78 [8];
  AssertionResult gtest_ar__30;
  AssertHelper local_1b48;
  Message local_1b40 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b30;
  string_view local_1b08;
  Lexer local_1af8;
  undefined8 local_1aa0;
  undefined1 local_1a98;
  bool local_1a89;
  undefined1 local_1a88 [8];
  AssertionResult gtest_ar__29;
  AssertHelper local_1a58;
  Message local_1a50 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a40;
  string_view local_1a18;
  Lexer local_1a08;
  undefined8 local_19ac;
  bool local_19a1;
  undefined1 local_19a0 [8];
  AssertionResult gtest_ar__28;
  AssertHelper local_1970;
  Message local_1968 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1958;
  string_view local_1930;
  Lexer local_1920;
  undefined8 local_18c8;
  undefined1 local_18c0;
  bool local_18b1;
  undefined1 local_18b0 [8];
  AssertionResult gtest_ar__27;
  AssertHelper local_1880;
  Message local_1878 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1868;
  string_view local_1840;
  Lexer local_1830;
  undefined8 local_17d4;
  bool local_17c9;
  undefined1 local_17c8 [8];
  AssertionResult gtest_ar__26;
  AssertHelper local_1798;
  Message local_1790 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1780;
  string_view local_1758;
  Lexer local_1748;
  undefined8 local_16f0;
  undefined1 local_16e8;
  bool local_16d9;
  undefined1 local_16d8 [8];
  AssertionResult gtest_ar__25;
  AssertHelper local_16a8;
  Message local_16a0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1690;
  string_view local_1668;
  Lexer local_1658;
  undefined8 local_15fc;
  bool local_15f1;
  undefined1 local_15f0 [8];
  AssertionResult gtest_ar__24;
  AssertHelper local_15c0;
  Message local_15b8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_15a8;
  string_view local_1580;
  Lexer local_1570;
  undefined8 local_1518;
  undefined1 local_1510;
  bool local_1501;
  undefined1 local_1500 [8];
  AssertionResult gtest_ar__23;
  AssertHelper local_14d0;
  Message local_14c8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_14b8;
  string_view local_1490;
  Lexer local_1480;
  undefined8 local_1424;
  bool local_1419;
  undefined1 local_1418 [8];
  AssertionResult gtest_ar__22;
  AssertHelper local_13e8;
  Message local_13e0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_13d0;
  string_view local_13a8;
  Lexer local_1398;
  undefined8 local_1340;
  undefined1 local_1338;
  bool local_1329;
  undefined1 local_1328 [8];
  AssertionResult gtest_ar__21;
  AssertHelper local_12f8;
  Message local_12f0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_12e0;
  string_view local_12b8;
  Lexer local_12a8;
  undefined8 local_124c;
  bool local_1241;
  undefined1 local_1240 [8];
  AssertionResult gtest_ar__20;
  AssertHelper local_1210;
  Message local_1208 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_11f8;
  string_view local_11d0;
  Lexer local_11c0;
  undefined8 local_1168;
  undefined1 local_1160;
  bool local_1151;
  undefined1 local_1150 [8];
  AssertionResult gtest_ar__19;
  AssertHelper local_1120;
  Message local_1118 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1108;
  string_view local_10e0;
  Lexer local_10d0;
  undefined8 local_1074;
  bool local_1069;
  undefined1 local_1068 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_1038;
  Message local_1030 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1020;
  string_view local_ff8;
  Lexer local_fe8;
  undefined8 local_f90;
  undefined1 local_f88;
  bool local_f79;
  undefined1 local_f78 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_f48;
  Message local_f40 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f30;
  string_view local_f08;
  Lexer local_ef8;
  undefined8 local_e9c;
  bool local_e91;
  undefined1 local_e90 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_e60;
  Message local_e58 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e48;
  string_view local_e20;
  Lexer local_e10;
  _Storage<double,_true> local_db8;
  undefined1 local_db0;
  undefined1 local_da8 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_d78;
  Message local_d70 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d60;
  string_view local_d38;
  Lexer local_d28;
  undefined8 local_ccc;
  bool local_cc1;
  undefined1 local_cc0 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_c90;
  Message local_c88 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c78;
  string_view local_c50;
  Lexer local_c40;
  _Storage<double,_true> local_be8;
  undefined1 local_be0;
  undefined1 local_bd8 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_ba8;
  Message local_ba0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b90;
  string_view local_b68;
  Lexer local_b58;
  _Storage<double,_true> local_b00;
  undefined1 local_af8;
  undefined1 local_af0 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_ac0;
  Message local_ab8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_aa8;
  string_view local_a80;
  Lexer local_a70;
  _Storage<double,_true> local_a18;
  undefined1 local_a10;
  undefined1 local_a08 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_9d8;
  Message local_9d0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9c0;
  string_view local_998;
  Lexer local_988;
  _Storage<double,_true> local_930;
  undefined1 local_928;
  undefined1 local_920 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_8f0;
  Message local_8e8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8d8;
  string_view local_8b0;
  Lexer local_8a0;
  _Storage<double,_true> local_848;
  undefined1 local_840;
  undefined1 local_838 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_808;
  Message local_800 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7f0;
  string_view local_7c8;
  Lexer local_7b8;
  _Optional_payload_base<float> local_760;
  undefined1 local_758 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_728;
  Message local_720 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_710;
  string_view local_6e8;
  Lexer local_6d8;
  _Storage<double,_true> local_680;
  undefined1 local_678;
  undefined1 local_670 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_640;
  Message local_638 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_628;
  string_view local_600;
  Lexer local_5f0;
  _Optional_payload_base<float> local_598;
  undefined1 local_590 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_560;
  Message local_558 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_548;
  string_view local_520;
  Lexer local_510;
  _Storage<double,_true> local_4b8;
  undefined1 local_4b0;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_478;
  Message local_470 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_460;
  string_view local_438;
  Lexer local_428;
  _Optional_payload_base<float> local_3d0;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_398;
  Message local_390 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_380;
  string_view local_358;
  Lexer local_348;
  _Storage<double,_true> local_2f0;
  undefined1 local_2e8;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_2b0;
  Message local_2a8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_298;
  string_view local_270;
  Lexer local_260;
  _Optional_payload_base<float> local_208;
  undefined1 local_200 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_1d0;
  Message local_1c8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  string_view local_190;
  Lexer local_180;
  _Storage<double,_true> local_128;
  undefined1 local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__1;
  string local_100;
  AssertHelper local_e0;
  Message local_d8 [4];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  string_view local_90;
  Lexer local_80;
  _Optional_payload_base<float> local_28;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  LexerTest_LexNan_Test *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_90 = sv("nan",3);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_80,local_90,&local_b8);
  local_28 = (_Optional_payload_base<float>)::wasm::WATParser::Lexer::takeF32();
  testing::AssertionResult::AssertionResult<std::optional<float>>
            ((AssertionResult *)local_20,(optional<float> *)&local_28,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_80);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_100,(internal *)local_20,(AssertionResult *)"Lexer(\"nan\"sv).takeF32()",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2be,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    testing::Message::~Message(local_d8);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_190 = sv("nan",3);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    ::wasm::WATParser::Lexer::Lexer(&local_180,local_190,&local_1b8);
    local_120 = ::wasm::WATParser::Lexer::takeF64();
    local_128 = extraout_XMM0_Qa;
    testing::AssertionResult::AssertionResult<std::optional<double>>
              ((AssertionResult *)local_118,(optional<double> *)&local_128,(type *)0x0);
    ::wasm::WATParser::Lexer::~Lexer(&local_180);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_1b8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
    if (!bVar1) {
      testing::Message::Message(local_1c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_118,
                 (AssertionResult *)"Lexer(\"nan\"sv).takeF64()","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                 ,0x2bf,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1d0,local_1c8);
      testing::internal::AssertHelper::~AssertHelper(&local_1d0);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(local_1c8);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      local_270 = sv("+nan",4);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional();
      ::wasm::WATParser::Lexer::Lexer(&local_260,local_270,&local_298);
      local_208 = (_Optional_payload_base<float>)::wasm::WATParser::Lexer::takeF32();
      testing::AssertionResult::AssertionResult<std::optional<float>>
                ((AssertionResult *)local_200,(optional<float> *)&local_208,(type *)0x0);
      ::wasm::WATParser::Lexer::~Lexer(&local_260);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_298);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
      if (!bVar1) {
        testing::Message::Message(local_2a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_200,
                   (AssertionResult *)"Lexer(\"+nan\"sv).takeF32()","false","true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_2b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                   ,0x2c1,pcVar2);
        testing::internal::AssertHelper::operator=(&local_2b0,local_2a8);
        testing::internal::AssertHelper::~AssertHelper(&local_2b0);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(local_2a8);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        local_358 = sv("+nan",4);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional();
        ::wasm::WATParser::Lexer::Lexer(&local_348,local_358,&local_380);
        local_2e8 = ::wasm::WATParser::Lexer::takeF64();
        local_2f0 = extraout_XMM0_Qa_00;
        testing::AssertionResult::AssertionResult<std::optional<double>>
                  ((AssertionResult *)local_2e0,(optional<double> *)&local_2f0,(type *)0x0);
        ::wasm::WATParser::Lexer::~Lexer(&local_348);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~optional(&local_380);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
        if (!bVar1) {
          testing::Message::Message(local_390);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_2e0,
                     (AssertionResult *)"Lexer(\"+nan\"sv).takeF64()","false","true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_398,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                     ,0x2c2,pcVar2);
          testing::internal::AssertHelper::operator=(&local_398,local_390);
          testing::internal::AssertHelper::~AssertHelper(&local_398);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(local_390);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          local_438 = sv("-nan",4);
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::optional();
          ::wasm::WATParser::Lexer::Lexer(&local_428,local_438,&local_460);
          local_3d0 = (_Optional_payload_base<float>)::wasm::WATParser::Lexer::takeF32();
          testing::AssertionResult::AssertionResult<std::optional<float>>
                    ((AssertionResult *)local_3c8,(optional<float> *)&local_3d0,(type *)0x0);
          ::wasm::WATParser::Lexer::~Lexer(&local_428);
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~optional(&local_460);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
          if (!bVar1) {
            testing::Message::Message(local_470);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__5.message_,(internal *)local_3c8,
                       (AssertionResult *)"Lexer(\"-nan\"sv).takeF32()","false","true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_478,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                       ,0x2c4,pcVar2);
            testing::internal::AssertHelper::operator=(&local_478,local_470);
            testing::internal::AssertHelper::~AssertHelper(&local_478);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(local_470);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            local_520 = sv("-nan",4);
            std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::optional();
            ::wasm::WATParser::Lexer::Lexer(&local_510,local_520,&local_548);
            local_4b0 = ::wasm::WATParser::Lexer::takeF64();
            local_4b8 = extraout_XMM0_Qa_01;
            testing::AssertionResult::AssertionResult<std::optional<double>>
                      ((AssertionResult *)local_4a8,(optional<double> *)&local_4b8,(type *)0x0);
            ::wasm::WATParser::Lexer::~Lexer(&local_510);
            std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~optional(&local_548);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
            if (!bVar1) {
              testing::Message::Message(local_558);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__6.message_,(internal *)local_4a8,
                         (AssertionResult *)"Lexer(\"-nan\"sv).takeF64()","false","true",in_R9);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_560,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                         ,0x2c5,pcVar2);
              testing::internal::AssertHelper::operator=(&local_560,local_558);
              testing::internal::AssertHelper::~AssertHelper(&local_560);
              std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
              testing::Message::~Message(local_558);
            }
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
            if (gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              local_600 = sv("nan:0x01",8);
              std::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::optional();
              ::wasm::WATParser::Lexer::Lexer(&local_5f0,local_600,&local_628);
              local_598 = (_Optional_payload_base<float>)::wasm::WATParser::Lexer::takeF32();
              testing::AssertionResult::AssertionResult<std::optional<float>>
                        ((AssertionResult *)local_590,(optional<float> *)&local_598,(type *)0x0);
              ::wasm::WATParser::Lexer::~Lexer(&local_5f0);
              std::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~optional(&local_628);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_590);
              if (!bVar1) {
                testing::Message::Message(local_638);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__7.message_,(internal *)local_590,
                           (AssertionResult *)"Lexer(\"nan:0x01\"sv).takeF32()","false","true",in_R9
                          );
                pcVar2 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_640,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                           ,0x2c7,pcVar2);
                testing::internal::AssertHelper::operator=(&local_640,local_638);
                testing::internal::AssertHelper::~AssertHelper(&local_640);
                std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                testing::Message::~Message(local_638);
              }
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_590);
              if (gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                local_6e8 = sv("nan:0x01",8);
                std::
                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::optional();
                ::wasm::WATParser::Lexer::Lexer(&local_6d8,local_6e8,&local_710);
                local_678 = ::wasm::WATParser::Lexer::takeF64();
                local_680 = extraout_XMM0_Qa_02;
                testing::AssertionResult::AssertionResult<std::optional<double>>
                          ((AssertionResult *)local_670,(optional<double> *)&local_680,(type *)0x0);
                ::wasm::WATParser::Lexer::~Lexer(&local_6d8);
                std::
                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~optional(&local_710);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_670);
                if (!bVar1) {
                  testing::Message::Message(local_720);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__8.message_,(internal *)local_670,
                             (AssertionResult *)"Lexer(\"nan:0x01\"sv).takeF64()","false","true",
                             in_R9);
                  pcVar2 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_728,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                             ,0x2c8,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_728,local_720);
                  testing::internal::AssertHelper::~AssertHelper(&local_728);
                  std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
                  testing::Message::~Message(local_720);
                }
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
                if (gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  local_7c8 = sv("+nan:0x01",9);
                  std::
                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::optional();
                  ::wasm::WATParser::Lexer::Lexer(&local_7b8,local_7c8,&local_7f0);
                  local_760 = (_Optional_payload_base<float>)::wasm::WATParser::Lexer::takeF32();
                  testing::AssertionResult::AssertionResult<std::optional<float>>
                            ((AssertionResult *)local_758,(optional<float> *)&local_760,(type *)0x0)
                  ;
                  ::wasm::WATParser::Lexer::~Lexer(&local_7b8);
                  std::
                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~optional(&local_7f0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_758);
                  if (!bVar1) {
                    testing::Message::Message(local_800);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__9.message_,(internal *)local_758,
                               (AssertionResult *)"Lexer(\"+nan:0x01\"sv).takeF32()","false","true",
                               in_R9);
                    pcVar2 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_808,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                               ,0x2ca,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_808,local_800);
                    testing::internal::AssertHelper::~AssertHelper(&local_808);
                    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
                    testing::Message::~Message(local_800);
                  }
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._5_3_ = 0;
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_758);
                  if (gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ == 0) {
                    local_8b0 = sv("+nan:0x01",9);
                    std::
                    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::optional();
                    ::wasm::WATParser::Lexer::Lexer(&local_8a0,local_8b0,&local_8d8);
                    local_840 = ::wasm::WATParser::Lexer::takeF64();
                    local_848 = extraout_XMM0_Qa_03;
                    testing::AssertionResult::AssertionResult<std::optional<double>>
                              ((AssertionResult *)local_838,(optional<double> *)&local_848,
                               (type *)0x0);
                    ::wasm::WATParser::Lexer::~Lexer(&local_8a0);
                    std::
                    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~optional(&local_8d8);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_838);
                    if (!bVar1) {
                      testing::Message::Message(local_8e8);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar__10.message_,(internal *)local_838,
                                 (AssertionResult *)"Lexer(\"+nan:0x01\"sv).takeF64()","false",
                                 "true",in_R9);
                      pcVar2 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_8f0,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                 ,0x2cb,pcVar2);
                      testing::internal::AssertHelper::operator=(&local_8f0,local_8e8);
                      testing::internal::AssertHelper::~AssertHelper(&local_8f0);
                      std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
                      testing::Message::~Message(local_8e8);
                    }
                    gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._5_3_ = 0;
                    gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_838);
                    if (gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_ == 0) {
                      local_998 = sv("-nan:0x01",9);
                      std::
                      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::optional();
                      ::wasm::WATParser::Lexer::Lexer(&local_988,local_998,&local_9c0);
                      local_928 = ::wasm::WATParser::Lexer::takeF64();
                      local_930 = extraout_XMM0_Qa_04;
                      testing::AssertionResult::AssertionResult<std::optional<double>>
                                ((AssertionResult *)local_920,(optional<double> *)&local_930,
                                 (type *)0x0);
                      ::wasm::WATParser::Lexer::~Lexer(&local_988);
                      std::
                      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~optional(&local_9c0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_920);
                      if (!bVar1) {
                        testing::Message::Message(local_9d0);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar__11.message_,(internal *)local_920,
                                   (AssertionResult *)"Lexer(\"-nan:0x01\"sv).takeF64()","false",
                                   "true",in_R9);
                        pcVar2 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_9d8,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                   ,0x2cd,pcVar2);
                        testing::internal::AssertHelper::operator=(&local_9d8,local_9d0);
                        testing::internal::AssertHelper::~AssertHelper(&local_9d8);
                        std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
                        testing::Message::~Message(local_9d0);
                      }
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._5_3_ = 0;
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_920);
                      if (gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_ == 0) {
                        local_a80 = sv("-nan:0x01",9);
                        std::
                        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::optional();
                        ::wasm::WATParser::Lexer::Lexer(&local_a70,local_a80,&local_aa8);
                        local_a10 = ::wasm::WATParser::Lexer::takeF64();
                        local_a18 = extraout_XMM0_Qa_05;
                        testing::AssertionResult::AssertionResult<std::optional<double>>
                                  ((AssertionResult *)local_a08,(optional<double> *)&local_a18,
                                   (type *)0x0);
                        ::wasm::WATParser::Lexer::~Lexer(&local_a70);
                        std::
                        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~optional(&local_aa8);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_a08);
                        if (!bVar1) {
                          testing::Message::Message(local_ab8);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar__12.message_,(internal *)local_a08,
                                     (AssertionResult *)"Lexer(\"-nan:0x01\"sv).takeF64()","false",
                                     "true",in_R9);
                          pcVar2 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_ac0,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                     ,0x2ce,pcVar2);
                          testing::internal::AssertHelper::operator=(&local_ac0,local_ab8);
                          testing::internal::AssertHelper::~AssertHelper(&local_ac0);
                          std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
                          testing::Message::~Message(local_ab8);
                        }
                        gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._5_3_ = 0;
                        gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_a08);
                        if (gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_ == 0) {
                          local_b68 = sv("nan:0x1234",10);
                          std::
                          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::optional();
                          ::wasm::WATParser::Lexer::Lexer(&local_b58,local_b68,&local_b90);
                          local_af8 = ::wasm::WATParser::Lexer::takeF64();
                          local_b00 = extraout_XMM0_Qa_06;
                          testing::AssertionResult::AssertionResult<std::optional<double>>
                                    ((AssertionResult *)local_af0,(optional<double> *)&local_b00,
                                     (type *)0x0);
                          ::wasm::WATParser::Lexer::~Lexer(&local_b58);
                          std::
                          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~optional(&local_b90);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_af0);
                          if (!bVar1) {
                            testing::Message::Message(local_ba0);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__13.message_,(internal *)local_af0,
                                       (AssertionResult *)"Lexer(\"nan:0x1234\"sv).takeF64()",
                                       "false","true",in_R9);
                            pcVar2 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_ba8,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                       ,0x2d0,pcVar2);
                            testing::internal::AssertHelper::operator=(&local_ba8,local_ba0);
                            testing::internal::AssertHelper::~AssertHelper(&local_ba8);
                            std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
                            testing::Message::~Message(local_ba0);
                          }
                          gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._5_3_ = 0;
                          gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_1_ = !bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_af0);
                          if (gtest_ar__1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_ == 0) {
                            local_c50 = sv("nan:0x1234",10);
                            std::
                            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::optional();
                            ::wasm::WATParser::Lexer::Lexer(&local_c40,local_c50,&local_c78);
                            local_be0 = ::wasm::WATParser::Lexer::takeF64();
                            local_be8 = extraout_XMM0_Qa_07;
                            testing::AssertionResult::AssertionResult<std::optional<double>>
                                      ((AssertionResult *)local_bd8,(optional<double> *)&local_be8,
                                       (type *)0x0);
                            ::wasm::WATParser::Lexer::~Lexer(&local_c40);
                            std::
                            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~optional(&local_c78);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_bd8);
                            if (!bVar1) {
                              testing::Message::Message(local_c88);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&gtest_ar__14.message_,(internal *)local_bd8,
                                         (AssertionResult *)"Lexer(\"nan:0x1234\"sv).takeF64()",
                                         "false","true",in_R9);
                              pcVar2 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_c90,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                         ,0x2d1,pcVar2);
                              testing::internal::AssertHelper::operator=(&local_c90,local_c88);
                              testing::internal::AssertHelper::~AssertHelper(&local_c90);
                              std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
                              testing::Message::~Message(local_c88);
                            }
                            gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._5_3_ = 0;
                            gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_1_ = !bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_bd8)
                            ;
                            if (gtest_ar__1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_ == 0) {
                              local_d38 = sv("nan:0xf_ffff_ffff_ffff",0x16);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::optional();
                              ::wasm::WATParser::Lexer::Lexer(&local_d28,local_d38,&local_d60);
                              local_ccc = ::wasm::WATParser::Lexer::takeF32();
                              local_cc1 = std::optional::operator_cast_to_bool
                                                    ((optional *)&local_ccc);
                              local_cc1 = !local_cc1;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_cc0,&local_cc1,(type *)0x0);
                              ::wasm::WATParser::Lexer::~Lexer(&local_d28);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~optional(&local_d60);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_cc0);
                              if (!bVar1) {
                                testing::Message::Message(local_d70);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__15.message_,(internal *)local_cc0,
                                           (AssertionResult *)
                                           "Lexer(\"nan:0xf_ffff_ffff_ffff\"sv).takeF32()","true",
                                           "false",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_d78,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2d3,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_d78,local_d70);
                                testing::internal::AssertHelper::~AssertHelper(&local_d78);
                                std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
                                testing::Message::~Message(local_d70);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_cc0);
                              local_e20 = sv("nan:0xf_ffff_ffff_ffff",0x16);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::optional();
                              ::wasm::WATParser::Lexer::Lexer(&local_e10,local_e20,&local_e48);
                              local_db0 = ::wasm::WATParser::Lexer::takeF64();
                              local_db8 = extraout_XMM0_Qa_08;
                              testing::AssertionResult::AssertionResult<std::optional<double>>
                                        ((AssertionResult *)local_da8,(optional<double> *)&local_db8
                                         ,(type *)0x0);
                              ::wasm::WATParser::Lexer::~Lexer(&local_e10);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~optional(&local_e48);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_da8);
                              if (!bVar1) {
                                testing::Message::Message(local_e58);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__16.message_,(internal *)local_da8,
                                           (AssertionResult *)
                                           "Lexer(\"nan:0xf_ffff_ffff_ffff\"sv).takeF64()","false",
                                           "true",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_e60,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2d4,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_e60,local_e58);
                                testing::internal::AssertHelper::~AssertHelper(&local_e60);
                                std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
                                testing::Message::~Message(local_e58);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_da8);
                              local_f08 = sv("nanjunk",7);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::optional();
                              ::wasm::WATParser::Lexer::Lexer(&local_ef8,local_f08,&local_f30);
                              local_e9c = ::wasm::WATParser::Lexer::takeF32();
                              local_e91 = std::optional::operator_cast_to_bool
                                                    ((optional *)&local_e9c);
                              local_e91 = !local_e91;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_e90,&local_e91,(type *)0x0);
                              ::wasm::WATParser::Lexer::~Lexer(&local_ef8);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~optional(&local_f30);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_e90);
                              if (!bVar1) {
                                testing::Message::Message(local_f40);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__17.message_,(internal *)local_e90,
                                           (AssertionResult *)"Lexer(\"nanjunk\"sv).takeF32()",
                                           "true","false",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_f48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2d6,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_f48,local_f40);
                                testing::internal::AssertHelper::~AssertHelper(&local_f48);
                                std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
                                testing::Message::~Message(local_f40);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_e90);
                              local_ff8 = sv("nanjunk",7);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::optional();
                              ::wasm::WATParser::Lexer::Lexer(&local_fe8,local_ff8,&local_1020);
                              local_f88 = ::wasm::WATParser::Lexer::takeF64();
                              local_f90 = extraout_XMM0_Qa_09;
                              local_f79 = std::optional::operator_cast_to_bool
                                                    ((optional *)&local_f90);
                              local_f79 = !local_f79;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_f78,&local_f79,(type *)0x0);
                              ::wasm::WATParser::Lexer::~Lexer(&local_fe8);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~optional(&local_1020);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_f78);
                              if (!bVar1) {
                                testing::Message::Message(local_1030);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__18.message_,(internal *)local_f78,
                                           (AssertionResult *)"Lexer(\"nanjunk\"sv).takeF64()",
                                           "true","false",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_1038,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2d7,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_1038,local_1030);
                                testing::internal::AssertHelper::~AssertHelper(&local_1038);
                                std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
                                testing::Message::~Message(local_1030);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_f78);
                              local_10e0 = sv("nan:",4);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::optional();
                              ::wasm::WATParser::Lexer::Lexer(&local_10d0,local_10e0,&local_1108);
                              local_1074 = ::wasm::WATParser::Lexer::takeF32();
                              local_1069 = std::optional::operator_cast_to_bool
                                                     ((optional *)&local_1074);
                              local_1069 = !local_1069;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_1068,&local_1069,(type *)0x0);
                              ::wasm::WATParser::Lexer::~Lexer(&local_10d0);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~optional(&local_1108);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_1068);
                              if (!bVar1) {
                                testing::Message::Message(local_1118);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__19.message_,(internal *)local_1068,
                                           (AssertionResult *)"Lexer(\"nan:\"sv).takeF32()","true",
                                           "false",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_1120,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2d9,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_1120,local_1118);
                                testing::internal::AssertHelper::~AssertHelper(&local_1120);
                                std::__cxx11::string::~string((string *)&gtest_ar__19.message_);
                                testing::Message::~Message(local_1118);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_1068);
                              local_11d0 = sv("nan:",4);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::optional();
                              ::wasm::WATParser::Lexer::Lexer(&local_11c0,local_11d0,&local_11f8);
                              local_1160 = ::wasm::WATParser::Lexer::takeF64();
                              local_1168 = extraout_XMM0_Qa_10;
                              local_1151 = std::optional::operator_cast_to_bool
                                                     ((optional *)&local_1168);
                              local_1151 = !local_1151;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_1150,&local_1151,(type *)0x0);
                              ::wasm::WATParser::Lexer::~Lexer(&local_11c0);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~optional(&local_11f8);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_1150);
                              if (!bVar1) {
                                testing::Message::Message(local_1208);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__20.message_,(internal *)local_1150,
                                           (AssertionResult *)"Lexer(\"nan:\"sv).takeF64()","true",
                                           "false",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_1210,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2da,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_1210,local_1208);
                                testing::internal::AssertHelper::~AssertHelper(&local_1210);
                                std::__cxx11::string::~string((string *)&gtest_ar__20.message_);
                                testing::Message::~Message(local_1208);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_1150);
                              local_12b8 = sv("nan:0x",6);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::optional();
                              ::wasm::WATParser::Lexer::Lexer(&local_12a8,local_12b8,&local_12e0);
                              local_124c = ::wasm::WATParser::Lexer::takeF32();
                              local_1241 = std::optional::operator_cast_to_bool
                                                     ((optional *)&local_124c);
                              local_1241 = !local_1241;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_1240,&local_1241,(type *)0x0);
                              ::wasm::WATParser::Lexer::~Lexer(&local_12a8);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~optional(&local_12e0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_1240);
                              if (!bVar1) {
                                testing::Message::Message(local_12f0);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__21.message_,(internal *)local_1240,
                                           (AssertionResult *)"Lexer(\"nan:0x\"sv).takeF32()","true"
                                           ,"false",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_12f8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2dc,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_12f8,local_12f0);
                                testing::internal::AssertHelper::~AssertHelper(&local_12f8);
                                std::__cxx11::string::~string((string *)&gtest_ar__21.message_);
                                testing::Message::~Message(local_12f0);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_1240);
                              local_13a8 = sv("nan:0x",6);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::optional();
                              ::wasm::WATParser::Lexer::Lexer(&local_1398,local_13a8,&local_13d0);
                              local_1338 = ::wasm::WATParser::Lexer::takeF64();
                              local_1340 = extraout_XMM0_Qa_11;
                              local_1329 = std::optional::operator_cast_to_bool
                                                     ((optional *)&local_1340);
                              local_1329 = !local_1329;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_1328,&local_1329,(type *)0x0);
                              ::wasm::WATParser::Lexer::~Lexer(&local_1398);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~optional(&local_13d0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_1328);
                              if (!bVar1) {
                                testing::Message::Message(local_13e0);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__22.message_,(internal *)local_1328,
                                           (AssertionResult *)"Lexer(\"nan:0x\"sv).takeF64()","true"
                                           ,"false",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_13e8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2dd,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_13e8,local_13e0);
                                testing::internal::AssertHelper::~AssertHelper(&local_13e8);
                                std::__cxx11::string::~string((string *)&gtest_ar__22.message_);
                                testing::Message::~Message(local_13e0);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_1328);
                              local_1490 = sv("nan:0xjunk",10);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::optional();
                              ::wasm::WATParser::Lexer::Lexer(&local_1480,local_1490,&local_14b8);
                              local_1424 = ::wasm::WATParser::Lexer::takeF32();
                              local_1419 = std::optional::operator_cast_to_bool
                                                     ((optional *)&local_1424);
                              local_1419 = !local_1419;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_1418,&local_1419,(type *)0x0);
                              ::wasm::WATParser::Lexer::~Lexer(&local_1480);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~optional(&local_14b8);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_1418);
                              if (!bVar1) {
                                testing::Message::Message(local_14c8);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__23.message_,(internal *)local_1418,
                                           (AssertionResult *)"Lexer(\"nan:0xjunk\"sv).takeF32()",
                                           "true","false",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_14d0,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2df,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_14d0,local_14c8);
                                testing::internal::AssertHelper::~AssertHelper(&local_14d0);
                                std::__cxx11::string::~string((string *)&gtest_ar__23.message_);
                                testing::Message::~Message(local_14c8);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_1418);
                              local_1580 = sv("nan:0xjunk",10);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::optional();
                              ::wasm::WATParser::Lexer::Lexer(&local_1570,local_1580,&local_15a8);
                              local_1510 = ::wasm::WATParser::Lexer::takeF64();
                              local_1518 = extraout_XMM0_Qa_12;
                              local_1501 = std::optional::operator_cast_to_bool
                                                     ((optional *)&local_1518);
                              local_1501 = !local_1501;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_1500,&local_1501,(type *)0x0);
                              ::wasm::WATParser::Lexer::~Lexer(&local_1570);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~optional(&local_15a8);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_1500);
                              if (!bVar1) {
                                testing::Message::Message(local_15b8);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__24.message_,(internal *)local_1500,
                                           (AssertionResult *)"Lexer(\"nan:0xjunk\"sv).takeF64()",
                                           "true","false",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_15c0,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2e0,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_15c0,local_15b8);
                                testing::internal::AssertHelper::~AssertHelper(&local_15c0);
                                std::__cxx11::string::~string((string *)&gtest_ar__24.message_);
                                testing::Message::~Message(local_15b8);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_1500);
                              local_1668 = sv("nan:-0x1",8);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::optional();
                              ::wasm::WATParser::Lexer::Lexer(&local_1658,local_1668,&local_1690);
                              local_15fc = ::wasm::WATParser::Lexer::takeF32();
                              local_15f1 = std::optional::operator_cast_to_bool
                                                     ((optional *)&local_15fc);
                              local_15f1 = !local_15f1;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_15f0,&local_15f1,(type *)0x0);
                              ::wasm::WATParser::Lexer::~Lexer(&local_1658);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~optional(&local_1690);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_15f0);
                              if (!bVar1) {
                                testing::Message::Message(local_16a0);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__25.message_,(internal *)local_15f0,
                                           (AssertionResult *)"Lexer(\"nan:-0x1\"sv).takeF32()",
                                           "true","false",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_16a8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2e2,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_16a8,local_16a0);
                                testing::internal::AssertHelper::~AssertHelper(&local_16a8);
                                std::__cxx11::string::~string((string *)&gtest_ar__25.message_);
                                testing::Message::~Message(local_16a0);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_15f0);
                              local_1758 = sv("nan:-0x1",8);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::optional();
                              ::wasm::WATParser::Lexer::Lexer(&local_1748,local_1758,&local_1780);
                              local_16e8 = ::wasm::WATParser::Lexer::takeF64();
                              local_16f0 = extraout_XMM0_Qa_13;
                              local_16d9 = std::optional::operator_cast_to_bool
                                                     ((optional *)&local_16f0);
                              local_16d9 = !local_16d9;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_16d8,&local_16d9,(type *)0x0);
                              ::wasm::WATParser::Lexer::~Lexer(&local_1748);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~optional(&local_1780);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_16d8);
                              if (!bVar1) {
                                testing::Message::Message(local_1790);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__26.message_,(internal *)local_16d8,
                                           (AssertionResult *)"Lexer(\"nan:-0x1\"sv).takeF64()",
                                           "true","false",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_1798,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2e3,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_1798,local_1790);
                                testing::internal::AssertHelper::~AssertHelper(&local_1798);
                                std::__cxx11::string::~string((string *)&gtest_ar__26.message_);
                                testing::Message::~Message(local_1790);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_16d8);
                              local_1840 = sv("nan:+0x1",8);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::optional();
                              ::wasm::WATParser::Lexer::Lexer(&local_1830,local_1840,&local_1868);
                              local_17d4 = ::wasm::WATParser::Lexer::takeF32();
                              local_17c9 = std::optional::operator_cast_to_bool
                                                     ((optional *)&local_17d4);
                              local_17c9 = !local_17c9;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_17c8,&local_17c9,(type *)0x0);
                              ::wasm::WATParser::Lexer::~Lexer(&local_1830);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~optional(&local_1868);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_17c8);
                              if (!bVar1) {
                                testing::Message::Message(local_1878);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__27.message_,(internal *)local_17c8,
                                           (AssertionResult *)"Lexer(\"nan:+0x1\"sv).takeF32()",
                                           "true","false",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_1880,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2e5,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_1880,local_1878);
                                testing::internal::AssertHelper::~AssertHelper(&local_1880);
                                std::__cxx11::string::~string((string *)&gtest_ar__27.message_);
                                testing::Message::~Message(local_1878);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_17c8);
                              local_1930 = sv("nan:+0x1",8);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::optional();
                              ::wasm::WATParser::Lexer::Lexer(&local_1920,local_1930,&local_1958);
                              local_18c0 = ::wasm::WATParser::Lexer::takeF64();
                              local_18c8 = extraout_XMM0_Qa_14;
                              local_18b1 = std::optional::operator_cast_to_bool
                                                     ((optional *)&local_18c8);
                              local_18b1 = !local_18b1;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_18b0,&local_18b1,(type *)0x0);
                              ::wasm::WATParser::Lexer::~Lexer(&local_1920);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~optional(&local_1958);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_18b0);
                              if (!bVar1) {
                                testing::Message::Message(local_1968);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__28.message_,(internal *)local_18b0,
                                           (AssertionResult *)"Lexer(\"nan:+0x1\"sv).takeF64()",
                                           "true","false",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_1970,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2e6,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_1970,local_1968);
                                testing::internal::AssertHelper::~AssertHelper(&local_1970);
                                std::__cxx11::string::~string((string *)&gtest_ar__28.message_);
                                testing::Message::~Message(local_1968);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_18b0);
                              local_1a18 = sv("nan:0x0",7);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::optional();
                              ::wasm::WATParser::Lexer::Lexer(&local_1a08,local_1a18,&local_1a40);
                              local_19ac = ::wasm::WATParser::Lexer::takeF32();
                              local_19a1 = std::optional::operator_cast_to_bool
                                                     ((optional *)&local_19ac);
                              local_19a1 = !local_19a1;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_19a0,&local_19a1,(type *)0x0);
                              ::wasm::WATParser::Lexer::~Lexer(&local_1a08);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~optional(&local_1a40);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_19a0);
                              if (!bVar1) {
                                testing::Message::Message(local_1a50);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__29.message_,(internal *)local_19a0,
                                           (AssertionResult *)"Lexer(\"nan:0x0\"sv).takeF32()",
                                           "true","false",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_1a58,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2e8,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_1a58,local_1a50);
                                testing::internal::AssertHelper::~AssertHelper(&local_1a58);
                                std::__cxx11::string::~string((string *)&gtest_ar__29.message_);
                                testing::Message::~Message(local_1a50);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_19a0);
                              local_1b08 = sv("nan:0x0",7);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::optional();
                              ::wasm::WATParser::Lexer::Lexer(&local_1af8,local_1b08,&local_1b30);
                              local_1a98 = ::wasm::WATParser::Lexer::takeF64();
                              local_1aa0 = extraout_XMM0_Qa_15;
                              local_1a89 = std::optional::operator_cast_to_bool
                                                     ((optional *)&local_1aa0);
                              local_1a89 = !local_1a89;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_1a88,&local_1a89,(type *)0x0);
                              ::wasm::WATParser::Lexer::~Lexer(&local_1af8);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~optional(&local_1b30);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_1a88);
                              if (!bVar1) {
                                testing::Message::Message(local_1b40);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__30.message_,(internal *)local_1a88,
                                           (AssertionResult *)"Lexer(\"nan:0x0\"sv).takeF64()",
                                           "true","false",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_1b48,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2e9,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_1b48,local_1b40);
                                testing::internal::AssertHelper::~AssertHelper(&local_1b48);
                                std::__cxx11::string::~string((string *)&gtest_ar__30.message_);
                                testing::Message::~Message(local_1b40);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_1a88);
                              local_1bf0 = sv("nan:0x10_0000_0000_0000",0x17);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::optional();
                              ::wasm::WATParser::Lexer::Lexer(&local_1be0,local_1bf0,&local_1c18);
                              local_1b84 = ::wasm::WATParser::Lexer::takeF32();
                              local_1b79 = std::optional::operator_cast_to_bool
                                                     ((optional *)&local_1b84);
                              local_1b79 = !local_1b79;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_1b78,&local_1b79,(type *)0x0);
                              ::wasm::WATParser::Lexer::~Lexer(&local_1be0);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~optional(&local_1c18);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_1b78);
                              if (!bVar1) {
                                testing::Message::Message(local_1c28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__31.message_,(internal *)local_1b78,
                                           (AssertionResult *)
                                           "Lexer(\"nan:0x10_0000_0000_0000\"sv).takeF32()","true",
                                           "false",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_1c30,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2eb,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_1c30,local_1c28);
                                testing::internal::AssertHelper::~AssertHelper(&local_1c30);
                                std::__cxx11::string::~string((string *)&gtest_ar__31.message_);
                                testing::Message::~Message(local_1c28);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_1b78);
                              local_1ce0 = sv("nan:0x10_0000_0000_0000",0x17);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::optional();
                              ::wasm::WATParser::Lexer::Lexer(&local_1cd0,local_1ce0,&local_1d08);
                              local_1c70 = ::wasm::WATParser::Lexer::takeF64();
                              local_1c78 = extraout_XMM0_Qa_16;
                              local_1c61 = std::optional::operator_cast_to_bool
                                                     ((optional *)&local_1c78);
                              local_1c61 = !local_1c61;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_1c60,&local_1c61,(type *)0x0);
                              ::wasm::WATParser::Lexer::~Lexer(&local_1cd0);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~optional(&local_1d08);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_1c60);
                              if (!bVar1) {
                                testing::Message::Message(local_1d18);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__32.message_,(internal *)local_1c60,
                                           (AssertionResult *)
                                           "Lexer(\"nan:0x10_0000_0000_0000\"sv).takeF64()","true",
                                           "false",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_1d20,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2ec,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_1d20,local_1d18);
                                testing::internal::AssertHelper::~AssertHelper(&local_1d20);
                                std::__cxx11::string::~string((string *)&gtest_ar__32.message_);
                                testing::Message::~Message(local_1d18);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_1c60);
                              local_1dc8 = sv("nan:0x1_0000_0000_0000_0000",0x1b);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::optional();
                              ::wasm::WATParser::Lexer::Lexer(&local_1db8,local_1dc8,&local_1df0);
                              local_1d5c = ::wasm::WATParser::Lexer::takeF32();
                              local_1d51 = std::optional::operator_cast_to_bool
                                                     ((optional *)&local_1d5c);
                              local_1d51 = !local_1d51;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_1d50,&local_1d51,(type *)0x0);
                              ::wasm::WATParser::Lexer::~Lexer(&local_1db8);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~optional(&local_1df0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_1d50);
                              if (!bVar1) {
                                testing::Message::Message(local_1e00);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__33.message_,(internal *)local_1d50,
                                           (AssertionResult *)
                                           "Lexer(\"nan:0x1_0000_0000_0000_0000\"sv).takeF32()",
                                           "true","false",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_1e08,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2ee,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_1e08,local_1e00);
                                testing::internal::AssertHelper::~AssertHelper(&local_1e08);
                                std::__cxx11::string::~string((string *)&gtest_ar__33.message_);
                                testing::Message::~Message(local_1e00);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_1d50);
                              local_1eb8 = sv("nan:0x1_0000_0000_0000_0000",0x1b);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::optional();
                              ::wasm::WATParser::Lexer::Lexer(&local_1ea8,local_1eb8,&local_1ee0);
                              local_1e48 = ::wasm::WATParser::Lexer::takeF64();
                              local_1e50 = extraout_XMM0_Qa_17;
                              local_1e39 = std::optional::operator_cast_to_bool
                                                     ((optional *)&local_1e50);
                              local_1e39 = !local_1e39;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_1e38,&local_1e39,(type *)0x0);
                              ::wasm::WATParser::Lexer::~Lexer(&local_1ea8);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~optional(&local_1ee0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_1e38);
                              if (!bVar1) {
                                testing::Message::Message(local_1ef0);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__34.message_,(internal *)local_1e38,
                                           (AssertionResult *)
                                           "Lexer(\"nan:0x1_0000_0000_0000_0000\"sv).takeF64()",
                                           "true","false",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_1ef8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2ef,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_1ef8,local_1ef0);
                                testing::internal::AssertHelper::~AssertHelper(&local_1ef8);
                                std::__cxx11::string::~string((string *)&gtest_ar__34.message_);
                                testing::Message::~Message(local_1ef0);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_1e38);
                              local_1fa0 = sv("NAN",3);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::optional();
                              ::wasm::WATParser::Lexer::Lexer(&local_1f90,local_1fa0,&local_1fc8);
                              local_1f34 = ::wasm::WATParser::Lexer::takeF32();
                              local_1f29 = std::optional::operator_cast_to_bool
                                                     ((optional *)&local_1f34);
                              local_1f29 = !local_1f29;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_1f28,&local_1f29,(type *)0x0);
                              ::wasm::WATParser::Lexer::~Lexer(&local_1f90);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~optional(&local_1fc8);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_1f28);
                              if (!bVar1) {
                                testing::Message::Message(local_1fd8);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__35.message_,(internal *)local_1f28,
                                           (AssertionResult *)"Lexer(\"NAN\"sv).takeF32()","true",
                                           "false",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_1fe0,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2f1,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_1fe0,local_1fd8);
                                testing::internal::AssertHelper::~AssertHelper(&local_1fe0);
                                std::__cxx11::string::~string((string *)&gtest_ar__35.message_);
                                testing::Message::~Message(local_1fd8);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_1f28);
                              local_2090 = sv("NAN",3);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::optional();
                              ::wasm::WATParser::Lexer::Lexer(&local_2080,local_2090,&local_20b8);
                              local_2020 = ::wasm::WATParser::Lexer::takeF64();
                              local_2028 = extraout_XMM0_Qa_18;
                              local_2011 = std::optional::operator_cast_to_bool
                                                     ((optional *)&local_2028);
                              local_2011 = !local_2011;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_2010,&local_2011,(type *)0x0);
                              ::wasm::WATParser::Lexer::~Lexer(&local_2080);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~optional(&local_20b8);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_2010);
                              if (!bVar1) {
                                testing::Message::Message(local_20c8);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__36.message_,(internal *)local_2010,
                                           (AssertionResult *)"Lexer(\"NAN\"sv).takeF64()","true",
                                           "false",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_20d0,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2f2,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_20d0,local_20c8);
                                testing::internal::AssertHelper::~AssertHelper(&local_20d0);
                                std::__cxx11::string::~string((string *)&gtest_ar__36.message_);
                                testing::Message::~Message(local_20c8);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_2010);
                              local_2178 = sv("NaN",3);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::optional();
                              ::wasm::WATParser::Lexer::Lexer(&local_2168,local_2178,&local_21a0);
                              local_210c = ::wasm::WATParser::Lexer::takeF32();
                              local_2101 = std::optional::operator_cast_to_bool
                                                     ((optional *)&local_210c);
                              local_2101 = !local_2101;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_2100,&local_2101,(type *)0x0);
                              ::wasm::WATParser::Lexer::~Lexer(&local_2168);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~optional(&local_21a0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_2100);
                              if (!bVar1) {
                                testing::Message::Message(local_21b0);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__37.message_,(internal *)local_2100,
                                           (AssertionResult *)"Lexer(\"NaN\"sv).takeF32()","true",
                                           "false",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_21b8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2f4,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_21b8,local_21b0);
                                testing::internal::AssertHelper::~AssertHelper(&local_21b8);
                                std::__cxx11::string::~string((string *)&gtest_ar__37.message_);
                                testing::Message::~Message(local_21b0);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_2100);
                              local_2268 = sv("NaN",3);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::optional();
                              ::wasm::WATParser::Lexer::Lexer(&local_2258,local_2268,&local_2290);
                              local_21f8 = ::wasm::WATParser::Lexer::takeF64();
                              local_2200 = extraout_XMM0_Qa_19;
                              local_21e9 = std::optional::operator_cast_to_bool
                                                     ((optional *)&local_2200);
                              local_21e9 = !local_21e9;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_21e8,&local_21e9,(type *)0x0);
                              ::wasm::WATParser::Lexer::~Lexer(&local_2258);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~optional(&local_2290);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_21e8);
                              if (!bVar1) {
                                testing::Message::Message(local_22a0);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          (&local_22c8,(internal *)local_21e8,
                                           (AssertionResult *)"Lexer(\"NaN\"sv).takeF64()","true",
                                           "false",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_22a8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x2f5,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_22a8,local_22a0);
                                testing::internal::AssertHelper::~AssertHelper(&local_22a8);
                                std::__cxx11::string::~string((string *)&local_22c8);
                                testing::Message::~Message(local_22a0);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_21e8);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(LexerTest, LexNan) {
  ASSERT_TRUE(Lexer("nan"sv).takeF32());
  ASSERT_TRUE(Lexer("nan"sv).takeF64());

  ASSERT_TRUE(Lexer("+nan"sv).takeF32());
  ASSERT_TRUE(Lexer("+nan"sv).takeF64());

  ASSERT_TRUE(Lexer("-nan"sv).takeF32());
  ASSERT_TRUE(Lexer("-nan"sv).takeF64());

  ASSERT_TRUE(Lexer("nan:0x01"sv).takeF32());
  ASSERT_TRUE(Lexer("nan:0x01"sv).takeF64());

  ASSERT_TRUE(Lexer("+nan:0x01"sv).takeF32());
  ASSERT_TRUE(Lexer("+nan:0x01"sv).takeF64());

  ASSERT_TRUE(Lexer("-nan:0x01"sv).takeF64());
  ASSERT_TRUE(Lexer("-nan:0x01"sv).takeF64());

  ASSERT_TRUE(Lexer("nan:0x1234"sv).takeF64());
  ASSERT_TRUE(Lexer("nan:0x1234"sv).takeF64());

  EXPECT_FALSE(Lexer("nan:0xf_ffff_ffff_ffff"sv).takeF32());
  EXPECT_TRUE(Lexer("nan:0xf_ffff_ffff_ffff"sv).takeF64());

  EXPECT_FALSE(Lexer("nanjunk"sv).takeF32());
  EXPECT_FALSE(Lexer("nanjunk"sv).takeF64());

  EXPECT_FALSE(Lexer("nan:"sv).takeF32());
  EXPECT_FALSE(Lexer("nan:"sv).takeF64());

  EXPECT_FALSE(Lexer("nan:0x"sv).takeF32());
  EXPECT_FALSE(Lexer("nan:0x"sv).takeF64());

  EXPECT_FALSE(Lexer("nan:0xjunk"sv).takeF32());
  EXPECT_FALSE(Lexer("nan:0xjunk"sv).takeF64());

  EXPECT_FALSE(Lexer("nan:-0x1"sv).takeF32());
  EXPECT_FALSE(Lexer("nan:-0x1"sv).takeF64());

  EXPECT_FALSE(Lexer("nan:+0x1"sv).takeF32());
  EXPECT_FALSE(Lexer("nan:+0x1"sv).takeF64());

  EXPECT_FALSE(Lexer("nan:0x0"sv).takeF32());
  EXPECT_FALSE(Lexer("nan:0x0"sv).takeF64());

  EXPECT_FALSE(Lexer("nan:0x10_0000_0000_0000"sv).takeF32());
  EXPECT_FALSE(Lexer("nan:0x10_0000_0000_0000"sv).takeF64());

  EXPECT_FALSE(Lexer("nan:0x1_0000_0000_0000_0000"sv).takeF32());
  EXPECT_FALSE(Lexer("nan:0x1_0000_0000_0000_0000"sv).takeF64());

  EXPECT_FALSE(Lexer("NAN"sv).takeF32());
  EXPECT_FALSE(Lexer("NAN"sv).takeF64());

  EXPECT_FALSE(Lexer("NaN"sv).takeF32());
  EXPECT_FALSE(Lexer("NaN"sv).takeF64());
}